

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSymbol.cpp
# Opt level: O2

BOOL Js::JavascriptSymbol::Equals
               (JavascriptSymbol *left,Var right,BOOL *value,ScriptContext *requestContext)

{
  PropertyRecord *pPVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  JavascriptSymbol *pJVar7;
  JavascriptSymbolObject *pJVar8;
  Var aValue;
  PropertyRecord *pPVar9;
  char *message;
  char *error;
  uint lineNumber;
  Type TVar10;
  
  if (right == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00bcade9;
    *puVar5 = 0;
  }
  bVar3 = TaggedInt::Is(right);
  if ((ulong)right >> 0x32 != 0 || bVar3) {
LAB_00bcab60:
    right = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)0>(right,requestContext);
    if (right == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00bcade9;
      *puVar5 = 0;
    }
    bVar3 = TaggedInt::Is(right);
    if ((Var)0x3ffffffffffff < right || bVar3) goto LAB_00bcadd4;
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(right);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00bcade9;
      *puVar5 = 0;
    }
    TVar10 = ((pRVar6->type).ptr)->typeId;
    if ((0x57 < (int)TVar10) && (BVar4 = RecyclableObject::IsExternal(pRVar6), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_00bcade9;
      *puVar5 = 0;
    }
  }
  else {
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(right);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00bcade9;
      *puVar5 = 0;
    }
    TVar10 = ((pRVar6->type).ptr)->typeId;
    if ((0x57 < (int)TVar10) && (BVar4 = RecyclableObject::IsExternal(pRVar6), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_00bcade9;
      *puVar5 = 0;
    }
    if ((TVar10 != TypeIds_Symbol) && (TVar10 != TypeIds_SymbolObject)) goto LAB_00bcab60;
  }
  if (TVar10 == TypeIds_SymbolObject) {
    pJVar8 = UnsafeVarTo<Js::JavascriptSymbolObject>(right);
    aValue = JavascriptSymbolObject::Unwrap(pJVar8);
    pJVar7 = UnsafeVarTo<Js::JavascriptSymbol>(aValue);
    *value = (uint)(pJVar7 == left);
    pPVar1 = (left->propertyRecordUsageCache).propertyRecord.ptr;
    pJVar8 = UnsafeVarTo<Js::JavascriptSymbolObject>(right);
    pJVar7 = (pJVar8->value).ptr;
    if (pJVar7 == (JavascriptSymbol *)0x0) {
      pPVar9 = (PropertyRecord *)0x0;
    }
    else {
      pPVar9 = (pJVar7->propertyRecordUsageCache).propertyRecord.ptr;
    }
    if (*value == (uint)(pPVar1 == pPVar9)) {
      return 1;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    value = (BOOL *)__tls_get_addr(&PTR_013e5f18);
    *value = 1;
    error = 
    "((left->GetValue() == UnsafeVarTo<JavascriptSymbolObject>(right)->GetValue()) == *value)";
    message = 
    "(left->GetValue() == UnsafeVarTo<JavascriptSymbolObject>(right)->GetValue()) == *value";
    lineNumber = 0x11c;
  }
  else {
    if (TVar10 != TypeIds_Symbol) goto LAB_00bcadd4;
    pJVar7 = UnsafeVarTo<Js::JavascriptSymbol>(right);
    *value = (uint)(pJVar7 == left);
    pPVar1 = (left->propertyRecordUsageCache).propertyRecord.ptr;
    pJVar7 = UnsafeVarTo<Js::JavascriptSymbol>(right);
    if (*value == (uint)(pPVar1 == (pJVar7->propertyRecordUsageCache).propertyRecord.ptr)) {
      return 1;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    value = (BOOL *)__tls_get_addr(&PTR_013e5f18);
    *value = 1;
    error = "((left->GetValue() == UnsafeVarTo<JavascriptSymbol>(right)->GetValue()) == *value)";
    message = "(left->GetValue() == UnsafeVarTo<JavascriptSymbol>(right)->GetValue()) == *value";
    lineNumber = 0x118;
  }
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                              ,lineNumber,error,message);
  if (!bVar3) {
LAB_00bcade9:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
LAB_00bcadd4:
  *value = 0;
  return 1;
}

Assistant:

BOOL JavascriptSymbol::Equals(JavascriptSymbol* left, Var right, BOOL* value, ScriptContext * requestContext)
    {
        TypeId typeId = JavascriptOperators::GetTypeId(right);
        if (typeId != TypeIds_Symbol && typeId != TypeIds_SymbolObject)
        {
            right = JavascriptConversion::ToPrimitive<JavascriptHint::None>(right, requestContext);
            typeId = JavascriptOperators::GetTypeId(right);
        }

        switch (typeId)
        {
        case TypeIds_Symbol:
            *value = left == UnsafeVarTo<JavascriptSymbol>(right);
            Assert((left->GetValue() == UnsafeVarTo<JavascriptSymbol>(right)->GetValue()) == *value);
            break;
        case TypeIds_SymbolObject:
            *value = left == UnsafeVarTo<JavascriptSymbol>(UnsafeVarTo<JavascriptSymbolObject>(right)->Unwrap());
            Assert((left->GetValue() == UnsafeVarTo<JavascriptSymbolObject>(right)->GetValue()) == *value);
            break;
        default:
            *value = FALSE;
            break;
        }

        return TRUE;
    }